

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  void *pvVar1;
  undefined4 uVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  uint64_t scopeId;
  int iVar6;
  uint64_t replacementScopeId;
  bool bVar7;
  undefined1 local_b8 [48];
  undefined1 local_88 [48];
  PointerReader local_58;
  
  if ((node->_reader).dataSize < 0x70) {
    sVar3 = 0;
  }
  else {
    sVar3 = *(short *)((long)(node->_reader).data + 0xc);
  }
  if ((replacement->_reader).dataSize < 0x70) {
    sVar4 = 0;
  }
  else {
    sVar4 = *(short *)((long)(replacement->_reader).data + 0xc);
  }
  if (sVar3 == sVar4) {
    bVar7 = (replacement->_reader).pointerCount < 6;
    local_b8._16_8_ = (replacement->_reader).pointers + 5;
    if (bVar7) {
      local_b8._16_8_ = (WirePointer *)0x0;
    }
    iVar6 = 0x7fffffff;
    uVar5 = (replacement->_reader).nestingLimit;
    if (bVar7) {
      uVar5 = 0x7fffffff;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
    }
    else {
      local_b8._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
      local_b8._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
      local_b8._8_4_ = *(undefined4 *)&(replacement->_reader).capTable;
      local_b8._12_4_ = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
    }
    local_b8._24_4_ = uVar5;
    capnp::_::PointerReader::getList
              ((ListReader *)local_88,(PointerReader *)local_b8,INLINE_COMPOSITE,(word *)0x0);
    uVar2 = local_88._24_4_;
    bVar7 = 5 < (node->_reader).pointerCount;
    local_58.pointer = (WirePointer *)0x0;
    if (bVar7) {
      iVar6 = (node->_reader).nestingLimit;
      local_58.pointer = (node->_reader).pointers + 5;
    }
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
    if (bVar7) {
      local_58.segment._0_4_ = *(undefined4 *)&(node->_reader).segment;
      local_58.segment._4_4_ = *(undefined4 *)((long)&(node->_reader).segment + 4);
      local_58.capTable._0_4_ = *(undefined4 *)&(node->_reader).capTable;
      local_58.capTable._4_4_ = *(undefined4 *)((long)&(node->_reader).capTable + 4);
    }
    local_58.nestingLimit = iVar6;
    capnp::_::PointerReader::getList((ListReader *)local_b8,&local_58,INLINE_COMPOSITE,(word *)0x0);
    if ((uint)local_b8._24_4_ < (uint)uVar2) {
      replacementIsNewer(this);
    }
    else {
      bVar7 = (replacement->_reader).pointerCount < 6;
      local_b8._16_8_ = (replacement->_reader).pointers + 5;
      if (bVar7) {
        local_b8._16_8_ = (WirePointer *)0x0;
      }
      iVar6 = 0x7fffffff;
      local_b8._24_4_ = (replacement->_reader).nestingLimit;
      if (bVar7) {
        local_b8._24_4_ = 0x7fffffff;
        local_b8._0_4_ = 0;
        local_b8._4_4_ = 0;
        local_b8._8_4_ = 0;
        local_b8._12_4_ = 0;
      }
      else {
        local_b8._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
        local_b8._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
        local_b8._8_4_ = *(undefined4 *)&(replacement->_reader).capTable;
        local_b8._12_4_ = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
      }
      capnp::_::PointerReader::getList
                ((ListReader *)local_88,(PointerReader *)local_b8,INLINE_COMPOSITE,(word *)0x0);
      bVar7 = 5 < (node->_reader).pointerCount;
      local_58.pointer = (WirePointer *)0x0;
      if (bVar7) {
        iVar6 = (node->_reader).nestingLimit;
        local_58.pointer = (node->_reader).pointers + 5;
      }
      local_58.segment._0_4_ = 0;
      local_58.segment._4_4_ = 0;
      local_58.capTable._0_4_ = 0;
      local_58.capTable._4_4_ = 0;
      if (bVar7) {
        local_58.segment._0_4_ = *(undefined4 *)&(node->_reader).segment;
        local_58.segment._4_4_ = *(undefined4 *)((long)&(node->_reader).segment + 4);
        local_58.capTable._0_4_ = *(undefined4 *)&(node->_reader).capTable;
        local_58.capTable._4_4_ = *(undefined4 *)((long)&(node->_reader).capTable + 4);
      }
      local_58.nestingLimit = iVar6;
      capnp::_::PointerReader::getList
                ((ListReader *)local_b8,&local_58,INLINE_COMPOSITE,(word *)0x0);
      if ((uint)local_88._24_4_ < (uint)local_b8._24_4_) {
        replacementIsOlder(this);
      }
    }
    uVar5 = (node->_reader).dataSize;
    if (0x6f < uVar5) {
      pvVar1 = (node->_reader).data;
      sVar3 = *(short *)((long)pvVar1 + 0xc);
      if (sVar3 == 3) {
        local_88._0_8_ = (node->_reader).segment;
        local_88._8_8_ = (node->_reader).capTable;
        local_88._16_8_ = (node->_reader).data;
        local_88._24_8_ = (node->_reader).pointers;
        local_88._32_4_ = (node->_reader).dataSize;
        local_88._36_2_ = (node->_reader).pointerCount;
        local_88[0x26] = (node->_reader).field_0x26;
        local_88[0x27] = (node->_reader).field_0x27;
        local_88._40_4_ = (node->_reader).nestingLimit;
        local_88._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
        local_b8._0_8_ = (replacement->_reader).segment;
        local_b8._8_8_ = (replacement->_reader).capTable;
        local_b8._16_8_ = (replacement->_reader).data;
        local_b8._24_8_ = (replacement->_reader).pointers;
        local_b8._32_4_ = (replacement->_reader).dataSize;
        local_b8._36_2_ = (replacement->_reader).pointerCount;
        local_b8[0x26] = (replacement->_reader).field_0x26;
        local_b8[0x27] = (replacement->_reader).field_0x27;
        local_b8._40_4_ = (replacement->_reader).nestingLimit;
        local_b8._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
        checkCompatibility(this,(Reader *)local_88,(Reader *)local_b8);
      }
      else if (sVar3 == 2) {
        local_88._0_8_ = (node->_reader).segment;
        local_88._8_8_ = (node->_reader).capTable;
        local_88._16_8_ = (node->_reader).data;
        local_88._24_8_ = (node->_reader).pointers;
        local_88._32_4_ = (node->_reader).dataSize;
        local_88._36_2_ = (node->_reader).pointerCount;
        local_88[0x26] = (node->_reader).field_0x26;
        local_88[0x27] = (node->_reader).field_0x27;
        local_88._40_4_ = (node->_reader).nestingLimit;
        local_88._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
        local_b8._0_8_ = (replacement->_reader).segment;
        local_b8._8_8_ = (replacement->_reader).capTable;
        local_b8._16_8_ = (replacement->_reader).data;
        local_b8._24_8_ = (replacement->_reader).pointers;
        local_b8._32_4_ = (replacement->_reader).dataSize;
        local_b8._36_2_ = (replacement->_reader).pointerCount;
        local_b8[0x26] = (replacement->_reader).field_0x26;
        local_b8[0x27] = (replacement->_reader).field_0x27;
        local_b8._40_4_ = (replacement->_reader).nestingLimit;
        local_b8._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
        checkCompatibility(this,(Reader *)local_88,(Reader *)local_b8);
      }
      else if (sVar3 == 1) {
        local_88._0_8_ = (node->_reader).segment;
        local_88._8_8_ = (node->_reader).capTable;
        local_88._16_8_ = (node->_reader).data;
        local_88._24_8_ = (node->_reader).pointers;
        local_88._32_4_ = (node->_reader).dataSize;
        local_88._36_2_ = (node->_reader).pointerCount;
        local_88[0x26] = (node->_reader).field_0x26;
        local_88[0x27] = (node->_reader).field_0x27;
        local_88._40_4_ = (node->_reader).nestingLimit;
        local_88._44_4_ = *(undefined4 *)&(node->_reader).field_0x2c;
        local_b8._0_8_ = (replacement->_reader).segment;
        local_b8._8_8_ = (replacement->_reader).capTable;
        local_b8._16_8_ = (replacement->_reader).data;
        local_b8._24_8_ = (replacement->_reader).pointers;
        local_b8._32_4_ = (replacement->_reader).dataSize;
        local_b8._36_2_ = (replacement->_reader).pointerCount;
        local_b8[0x26] = (replacement->_reader).field_0x26;
        local_b8[0x27] = (replacement->_reader).field_0x27;
        local_b8._40_4_ = (replacement->_reader).nestingLimit;
        local_b8._44_4_ = *(undefined4 *)&(replacement->_reader).field_0x2c;
        if (uVar5 < 0xc0) {
          scopeId = 0;
        }
        else {
          scopeId = *(uint64_t *)((long)pvVar1 + 0x10);
        }
        if ((replacement->_reader).dataSize < 0xc0) {
          replacementScopeId = 0;
        }
        else {
          replacementScopeId = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
        }
        checkCompatibility(this,(Reader *)local_88,(Reader *)local_b8,scopeId,replacementScopeId);
      }
    }
  }
  else {
    checkCompatibility(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }